

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_comparison_expression.cpp
# Opt level: O3

LogicalType *
duckdb::BoundComparisonExpression::BindComparison
          (LogicalType *__return_storage_ptr__,ClientContext *context,LogicalType *left_type,
          LogicalType *right_type,ExpressionType comparison_type)

{
  bool bVar1;
  BinderException *this;
  string local_90;
  string local_70;
  string local_50;
  
  LogicalType::LogicalType(__return_storage_ptr__);
  bVar1 = TryBindComparison(context,left_type,right_type,__return_storage_ptr__,comparison_type);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "Cannot mix values of type %s and %s - an explicit cast is required","");
  LogicalType::ToString_abi_cxx11_(&local_50,left_type);
  LogicalType::ToString_abi_cxx11_(&local_70,right_type);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_90,&local_50,&local_70);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

LogicalType BoundComparisonExpression::BindComparison(ClientContext &context, const LogicalType &left_type,
                                                      const LogicalType &right_type, ExpressionType comparison_type) {
	LogicalType result_type;
	if (!BoundComparisonExpression::TryBindComparison(context, left_type, right_type, result_type, comparison_type)) {
		throw BinderException("Cannot mix values of type %s and %s - an explicit cast is required",
		                      left_type.ToString(), right_type.ToString());
	}
	return result_type;
}